

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall
QL_Manager::RunUpdate
          (QL_Manager *this,QL_Node *topNode,RelAttr *updAttr,int bIsValue,RelAttr *rhsRelAttr,
          Value *rhsValue)

{
  RC RVar1;
  size_t sVar2;
  char *pcStack_148;
  int valueLength;
  char *pData;
  RID rid;
  RM_Record rec;
  IX_IndexHandle ih;
  int local_ec;
  int local_e8;
  int index2;
  int index1;
  RM_FileHandle relFH;
  undefined1 local_88 [8];
  Printer printer;
  DataAttrInfo *attributes;
  int *attrList;
  int local_48;
  int attrListSize;
  int finalTupLength;
  RC rc;
  Value *rhsValue_local;
  RelAttr *rhsRelAttr_local;
  RelAttr *pRStack_28;
  int bIsValue_local;
  RelAttr *updAttr_local;
  QL_Node *topNode_local;
  QL_Manager *this_local;
  
  attrListSize = 0;
  _finalTupLength = rhsValue;
  rhsValue_local = (Value *)rhsRelAttr;
  rhsRelAttr_local._4_4_ = bIsValue;
  pRStack_28 = updAttr;
  updAttr_local = (RelAttr *)topNode;
  topNode_local = (QL_Node *)this;
  QL_Node::GetTupleLength(topNode,&local_48);
  attrListSize = QL_Node::GetAttrList
                           ((QL_Node *)updAttr_local,(int **)&attributes,
                            (int *)((long)&attrList + 4));
  if (attrListSize != 0) {
    return attrListSize;
  }
  printer._32_8_ = malloc((long)attrList._4_4_ * 0x44);
  attrListSize = SetUpPrinter(this,(QL_Node *)updAttr_local,(DataAttrInfo *)printer._32_8_);
  if (attrListSize != 0) {
    return attrListSize;
  }
  Printer::Printer((Printer *)local_88,(DataAttrInfo *)printer._32_8_,attrList._4_4_);
  Printer::PrintHeader((Printer *)local_88,(ostream *)&std::cout);
  RM_FileHandle::RM_FileHandle((RM_FileHandle *)&index1);
  attrListSize = RM_Manager::OpenFile(this->rmm,this->relEntries->relName,(RM_FileHandle *)&index1);
  if (attrListSize != 0) {
    index2 = 1;
    this_local._4_4_ = attrListSize;
    goto LAB_0011c5c2;
  }
  attrListSize = GetAttrCatEntryPos(this,*pRStack_28,&local_e8);
  if (attrListSize != 0) {
    index2 = 1;
    this_local._4_4_ = attrListSize;
    goto LAB_0011c5c2;
  }
  if ((rhsRelAttr_local._4_4_ == 0) &&
     (attrListSize = GetAttrCatEntryPos(this,*(RelAttr *)rhsValue_local,&local_ec),
     attrListSize != 0)) {
    index2 = 1;
    this_local._4_4_ = attrListSize;
    goto LAB_0011c5c2;
  }
  attrListSize = 0;
  IX_IndexHandle::IX_IndexHandle((IX_IndexHandle *)&rec.field_0x17);
  if (this->attrEntries[local_e8].indexNo == -1) {
LAB_0011bf11:
    attrListSize = (**(code **)updAttr_local->relName)();
    if (attrListSize == 0) {
      RM_Record::RM_Record((RM_Record *)&rid);
      RID::RID((RID *)&pData);
      do {
        attrListSize = (**(code **)(updAttr_local->relName + 0x10))(updAttr_local,&rid);
        if (attrListSize != 0) {
          this_local._4_4_ = attrListSize;
          if (((attrListSize == 0x199) &&
              (attrListSize = (**(code **)(updAttr_local->relName + 0x18))(),
              this_local._4_4_ = attrListSize, attrListSize == 0)) &&
             ((this->attrEntries[local_e8].indexNo == -1 ||
              (attrListSize = IX_Manager::CloseIndex(this->ixm,(IX_IndexHandle *)&rec.field_0x17),
              this_local._4_4_ = attrListSize, attrListSize == 0)))) {
            attrListSize = 0;
            attrListSize = RM_Manager::CloseFile(this->rmm,(RM_FileHandle *)&index1);
            this_local._4_4_ = attrListSize;
            if (attrListSize == 0) {
              Printer::PrintFooter((Printer *)local_88,(ostream *)&std::cout);
              free((void *)printer._32_8_);
              this_local._4_4_ = 0;
            }
          }
          goto LAB_0011c57e;
        }
        attrListSize = RM_Record::GetRid((RM_Record *)&rid,(RID *)&pData);
        if ((attrListSize != 0) ||
           (attrListSize = RM_Record::GetData((RM_Record *)&rid,&stack0xfffffffffffffeb8),
           attrListSize != 0)) {
          this_local._4_4_ = attrListSize;
          goto LAB_0011c57e;
        }
        if ((this->attrEntries[local_e8].indexNo != -1) &&
           (RVar1 = IX_IndexHandle::DeleteEntry
                              ((IX_IndexHandle *)&rec.field_0x17,
                               pcStack_148 + this->attrEntries[local_e8].offset,(RID *)&pData),
           RVar1 != 0)) {
          this_local._4_4_ = attrListSize;
          goto LAB_0011c57e;
        }
        if (rhsRelAttr_local._4_4_ == 0) {
          if (this->attrEntries[local_ec].attrLength < this->attrEntries[local_e8].attrLength) {
            memcpy(pcStack_148 + this->attrEntries[local_e8].offset,
                   pcStack_148 + this->attrEntries[local_ec].offset,
                   (long)this->attrEntries[local_ec].attrLength);
            pcStack_148[this->attrEntries[local_e8].offset + this->attrEntries[local_ec].attrLength]
                 = '\0';
          }
          else {
            memcpy(pcStack_148 + this->attrEntries[local_e8].offset,
                   pcStack_148 + this->attrEntries[local_ec].offset,
                   (long)this->attrEntries[local_e8].attrLength);
          }
        }
        else if (this->attrEntries[local_e8].attrType == STRING) {
          sVar2 = strlen((char *)_finalTupLength->data);
          if ((int)sVar2 + 1 < this->attrEntries[local_e8].attrLength) {
            memcpy(pcStack_148 + this->attrEntries[local_e8].offset,_finalTupLength->data,
                   (long)((int)sVar2 + 1));
          }
          else {
            memcpy(pcStack_148 + this->attrEntries[local_e8].offset,_finalTupLength->data,
                   (long)this->attrEntries[local_e8].attrLength);
          }
        }
        else {
          memcpy(pcStack_148 + this->attrEntries[local_e8].offset,_finalTupLength->data,
                 (long)this->attrEntries[local_e8].attrLength);
        }
        attrListSize = RM_FileHandle::UpdateRec((RM_FileHandle *)&index1,(RM_Record *)&rid);
        this_local._4_4_ = attrListSize;
        if (attrListSize != 0) goto LAB_0011c57e;
        Printer::Print((Printer *)local_88,(ostream *)&std::cout,pcStack_148);
      } while ((this->attrEntries[local_e8].indexNo == -1) ||
              (RVar1 = IX_IndexHandle::InsertEntry
                                 ((IX_IndexHandle *)&rec.field_0x17,
                                  pcStack_148 + this->attrEntries[local_e8].offset,(RID *)&pData),
              RVar1 == 0));
      this_local._4_4_ = attrListSize;
LAB_0011c57e:
      index2 = 1;
      RID::~RID((RID *)&pData);
      RM_Record::~RM_Record((RM_Record *)&rid);
    }
    else {
      index2 = 1;
      this_local._4_4_ = attrListSize;
    }
  }
  else {
    attrListSize = IX_Manager::OpenIndex
                             (this->ixm,this->relEntries->relName,
                              this->attrEntries[local_e8].indexNo,(IX_IndexHandle *)&rec.field_0x17)
    ;
    if (attrListSize == 0) {
      attrListSize = 0;
      goto LAB_0011bf11;
    }
    index2 = 1;
    this_local._4_4_ = attrListSize;
  }
  IX_IndexHandle::~IX_IndexHandle((IX_IndexHandle *)&rec.field_0x17);
LAB_0011c5c2:
  RM_FileHandle::~RM_FileHandle((RM_FileHandle *)&index1);
  Printer::~Printer((Printer *)local_88);
  return this_local._4_4_;
}

Assistant:

RC QL_Manager::RunUpdate(QL_Node *topNode, const RelAttr &updAttr,
                      const int bIsValue,
                      const RelAttr &rhsRelAttr,
                      const Value &rhsValue){
  RC rc = 0;
  // Retrieves the attributes in this relation for the printer setup
  int finalTupLength, attrListSize;
  topNode->GetTupleLength(finalTupLength);
  int *attrList;
  if((rc = topNode->GetAttrList(attrList, attrListSize)))
    return (rc);
  DataAttrInfo * attributes = (DataAttrInfo *)malloc(attrListSize* sizeof(DataAttrInfo));
  if((rc = SetUpPrinter(topNode, attributes)))
    return (rc);
  Printer printer(attributes, attrListSize);
  printer.PrintHeader(cout);


  // Open the file
  RM_FileHandle relFH;
  if((rc = rmm.OpenFile(relEntries->relName, relFH)))
    return (rc);

  int index1, index2; // Get the attrEntries indices to the RHS and LHS attributes
  if((rc = GetAttrCatEntryPos(updAttr, index1)))
    return (rc);
  if(!bIsValue){
    if((rc = GetAttrCatEntryPos(rhsRelAttr, index2)))
      return (rc);
  }

  // Get the index to the attribute to be update, if there is one
  IX_IndexHandle ih;
  if((attrEntries[index1].indexNo != -1)){
    if((rc = ixm.OpenIndex(relEntries->relName, attrEntries[index1].indexNo, ih)))
      return (rc);
  }

  // Find all tuples that meet the condition
  if((rc = topNode->OpenIt() ))
    return (rc);
  RM_Record rec;
  RID rid;
  while(true){
    if((rc = topNode->GetNextRec(rec))){
      if (rc == QL_EOI){
        break;
      }
      return (rc);
    }
    char *pData;
    if((rc = rec.GetRid(rid)) || (rc = rec.GetData(pData)) )
      return (rc);
    if(attrEntries[index1].indexNo != -1){ // Delete this value from the index
      if((ih.DeleteEntry(pData + attrEntries[index1].offset, rid)))
        return (rc);
    }
    
    // Set the attribute to its new value
    if(bIsValue){
      if(attrEntries[index1].attrType == STRING){
        int valueLength = strlen((char *)rhsValue.data);
        if(attrEntries[index1].attrLength <= (valueLength + 1) )
          memcpy(pData + attrEntries[index1].offset, (char *)rhsValue.data, attrEntries[index1].attrLength);
        else
          memcpy(pData + attrEntries[index1].offset, (char *)rhsValue.data, valueLength + 1);
      }
      else
        memcpy(pData + attrEntries[index1].offset, (char *)rhsValue.data, attrEntries[index1].attrLength);
    }
    else{
      if(attrEntries[index2].attrLength >= attrEntries[index1].attrLength)
        memcpy(pData + attrEntries[index1].offset, pData + attrEntries[index2].offset, attrEntries[index1].attrLength);
      else{
        memcpy(pData + attrEntries[index1].offset, pData + attrEntries[index2].offset, attrEntries[index2].attrLength);
        pData[attrEntries[index1].offset + attrEntries[index2].attrLength] = '\0';
      }
    }

    // Upate this record in the file
    if((rc = relFH.UpdateRec(rec)))
      return (rc);
    printer.Print(cout, pData);
    
    // Update the record in the index
    if(attrEntries[index1].indexNo != -1){
      if((ih.InsertEntry(pData + attrEntries[index1].offset, rid)))
        return (rc);
    }

  }
  if((rc = topNode->CloseIt()))
    return (rc);
    
  if((attrEntries[index1].indexNo != -1)){ // Close file and indices
    if((rc = ixm.CloseIndex(ih)))
      return (rc);
  }
  if((rc = rmm.CloseFile(relFH)))
    return (rc);

  printer.PrintFooter(cout);
  free(attributes);

  return (0);
}